

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O3

Result wabt::GenerateNames(Module *module,NameOpts opts)

{
  ulong *puVar1;
  Import *pIVar2;
  pointer pcVar3;
  pointer ppEVar4;
  Export *pEVar5;
  pointer pTVar6;
  pointer pTVar7;
  Index IVar8;
  Index IVar9;
  Index IVar10;
  Index IVar11;
  Result RVar12;
  long *plVar13;
  Func *pFVar14;
  pointer ppGVar15;
  pointer ppTVar16;
  pointer ppFVar17;
  pointer pbVar18;
  pointer ppTVar19;
  pointer ppMVar20;
  pointer ppTVar21;
  pointer ppDVar22;
  pointer ppEVar23;
  pointer ppGVar24;
  pointer ppTVar25;
  pointer pbVar26;
  pointer ppTVar27;
  pointer ppMVar28;
  pointer ppTVar29;
  pointer ppDVar30;
  pointer ppEVar31;
  char *prefix;
  pointer ppIVar32;
  ulong uVar33;
  pointer ppEVar34;
  BindingHash *bindings;
  long lVar35;
  Module *pMVar36;
  __string_type __str;
  string new_name;
  NameGenerator generator;
  undefined1 local_118 [32];
  pointer local_f8;
  Module *local_f0;
  string local_e8;
  NameGenerator local_c8;
  
  local_c8.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameGenerator_001a2d68;
  local_c8.module_ = (Module *)0x0;
  ExprVisitor::ExprVisitor(&local_c8.visitor_,(Delegate *)&local_c8);
  local_c8.num_global_imports_ = 0;
  local_c8.num_tag_imports_ = 0;
  local_c8.label_count_ = 0;
  local_c8.num_func_imports_ = 0;
  local_c8.num_table_imports_ = 0;
  local_c8.num_memory_imports_ = 0;
  ppIVar32 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_f8 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_f0 = module;
  local_c8.module_ = module;
  local_c8.opts_ = opts;
  if (ppIVar32 != local_f8) {
    do {
      pIVar2 = *ppIVar32;
      IVar9 = local_c8.num_global_imports_;
      IVar10 = local_c8.num_tag_imports_;
      IVar11 = local_c8.num_table_imports_;
      IVar8 = local_c8.num_memory_imports_;
      switch(pIVar2->kind_) {
      case First:
        bindings = &(local_c8.module_)->func_bindings;
        IVar11 = local_c8.num_func_imports_;
        local_c8.num_func_imports_ = local_c8.num_func_imports_ + 1;
        break;
      case Table:
        bindings = &(local_c8.module_)->table_bindings;
        local_c8.num_table_imports_ = local_c8.num_table_imports_ + 1;
        break;
      case Memory:
        bindings = &(local_c8.module_)->memory_bindings;
        local_c8.num_memory_imports_ = local_c8.num_memory_imports_ + 1;
        IVar11 = IVar8;
        break;
      case Global:
        bindings = &(local_c8.module_)->global_bindings;
        local_c8.num_global_imports_ = local_c8.num_global_imports_ + 1;
        IVar11 = IVar9;
        break;
      case Last:
        bindings = &(local_c8.module_)->tag_bindings;
        local_c8.num_tag_imports_ = local_c8.num_tag_imports_ + 1;
        IVar11 = IVar10;
        break;
      default:
        goto switchD_0012f6cb_default;
      }
      if (IVar11 == 0xffffffff) {
        __assert_fail("index != kInvalidIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/generate-names.cc"
                      ,0x152,
                      "Result wabt::(anonymous namespace)::NameGenerator::VisitImport(Import *)");
      }
      local_118._0_8_ = local_118 + 0x10;
      pcVar3 = (pIVar2->module_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_118,pcVar3,pcVar3 + (pIVar2->module_name)._M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)local_118,local_118._8_8_,0,'\x01');
      plVar13 = (long *)std::__cxx11::string::_M_append
                                  (local_118,(ulong)(pIVar2->field_name)._M_dataplus._M_p);
      puVar1 = (ulong *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1) {
        local_e8.field_2._M_allocated_capacity = *puVar1;
        local_e8.field_2._8_8_ = plVar13[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *puVar1;
        local_e8._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_e8._M_string_length = plVar13[1];
      *plVar13 = (long)puVar1;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_118._16_8_)->_M_p + 1));
      }
      anon_unknown_17::NameGenerator::MaybeUseAndBindName
                (&local_c8,bindings,local_e8._M_dataplus._M_p,IVar11,(string *)(pIVar2 + 1));
      module = local_f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        module = local_f0;
      }
switchD_0012f6cb_default:
      ppIVar32 = ppIVar32 + 1;
    } while (ppIVar32 != local_f8);
  }
  ppEVar4 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pMVar36 = local_f0;
  for (ppEVar34 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; local_f0 = pMVar36, ppEVar34 != ppEVar4;
      ppEVar34 = ppEVar34 + 1) {
    pEVar5 = *ppEVar34;
    switch(pEVar5->kind) {
    case First:
      pFVar14 = Module::GetFunc(local_c8.module_,&pEVar5->var);
      if (pFVar14 != (Func *)0x0) {
        IVar11 = Module::GetFuncIndex(local_c8.module_,&pEVar5->var);
        lVar35 = 0x1c8;
LAB_0012f993:
        anon_unknown_17::NameGenerator::MaybeUseAndBindName
                  (&local_c8,
                   (BindingHash *)((long)&((local_c8.module_)->loc).filename._M_len + lVar35),
                   (pEVar5->name)._M_dataplus._M_p,IVar11,&pFVar14->name);
      }
      break;
    case Table:
      pFVar14 = (Func *)Module::GetTable(local_c8.module_,&pEVar5->var);
      if (pFVar14 != (Func *)0x0) {
        IVar11 = Module::GetTableIndex(local_c8.module_,&pEVar5->var);
        lVar35 = 0x2a8;
        goto LAB_0012f993;
      }
      break;
    case Memory:
      pFVar14 = (Func *)Module::GetMemory(local_c8.module_,&pEVar5->var);
      if (pFVar14 != (Func *)0x0) {
        IVar11 = Module::GetMemoryIndex(local_c8.module_,&pEVar5->var);
        lVar35 = 0x2e0;
        goto LAB_0012f993;
      }
      break;
    case Global:
      pFVar14 = (Func *)Module::GetGlobal(local_c8.module_,&pEVar5->var);
      if (pFVar14 != (Func *)0x0) {
        IVar11 = Module::GetGlobalIndex(local_c8.module_,&pEVar5->var);
        lVar35 = 0x200;
        goto LAB_0012f993;
      }
      break;
    case Last:
      pFVar14 = (Func *)Module::GetTag(local_c8.module_,&pEVar5->var);
      if (pFVar14 != (Func *)0x0) {
        IVar11 = Module::GetTagIndex(local_c8.module_,&pEVar5->var);
        lVar35 = 400;
        goto LAB_0012f993;
      }
    }
    pMVar36 = local_f0;
  }
  ppGVar15 = (pMVar36->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar24 = (pMVar36->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar24 != ppGVar15) {
    uVar33 = 0;
    do {
      if ((ppGVar15[uVar33]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->global_bindings,"g",(Index)uVar33,
                   &ppGVar15[uVar33]->name);
        ppGVar15 = (pMVar36->globals).
                   super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppGVar24 = (pMVar36->globals).
                   super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      uVar33 = (ulong)((Index)uVar33 + 1);
    } while (uVar33 < (ulong)((long)ppGVar24 - (long)ppGVar15 >> 3));
  }
  ppTVar16 = (pMVar36->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar25 = (pMVar36->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppTVar25 != ppTVar16) {
    uVar33 = 0;
    do {
      if ((ppTVar16[uVar33]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->type_bindings,"t",(Index)uVar33,
                   &ppTVar16[uVar33]->name);
        ppTVar16 = (pMVar36->types).
                   super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppTVar25 = (pMVar36->types).
                   super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
      }
      uVar33 = (ulong)((Index)uVar33 + 1);
    } while (uVar33 < (ulong)((long)ppTVar25 - (long)ppTVar16 >> 3));
  }
  ppFVar17 = (pMVar36->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((pMVar36->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar17) {
    ppIVar32 = (pointer)0x0;
    do {
      pFVar14 = ppFVar17[(long)ppIVar32];
      if ((pFVar14->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->func_bindings,"f",(Index)ppIVar32,&pFVar14->name);
      }
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (pointer)0x0;
      local_118._16_8_ = (pointer)0x0;
      pTVar6 = (pFVar14->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar7 = (pFVar14->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_f8 = ppIVar32;
      IVar11 = LocalTypes::size(&pFVar14->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)((int)((ulong)((long)pTVar6 - (long)pTVar7) >> 3) + IVar11),
                 &pFVar14->bindings,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_118);
      if (local_118._8_8_ != local_118._0_8_) {
        lVar35 = 0;
        uVar33 = 0;
        pbVar18 = (pointer)local_118._0_8_;
        pbVar26 = (pointer)local_118._8_8_;
        do {
          if (*(long *)((long)&pbVar18->_M_string_length + lVar35) == 0) {
            prefix = "p";
            if (((ulong)((long)(pFVar14->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pFVar14->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3 & 0xffffffff) <= uVar33) {
              prefix = "l";
            }
            local_e8._M_string_length = 0;
            local_e8.field_2._M_allocated_capacity =
                 local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            anon_unknown_17::NameGenerator::GenerateAndBindName
                      (&local_c8,&pFVar14->bindings,prefix,(Index)uVar33,&local_e8);
            std::__cxx11::string::_M_assign
                      ((string *)((long)&((_Alloc_hider *)local_118._0_8_)->_M_p + lVar35));
            pbVar18 = (pointer)local_118._0_8_;
            pbVar26 = (pointer)local_118._8_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
              pbVar18 = (pointer)local_118._0_8_;
              pbVar26 = (pointer)local_118._8_8_;
            }
          }
          uVar33 = uVar33 + 1;
          lVar35 = lVar35 + 0x20;
        } while (uVar33 < (ulong)((long)pbVar26 - (long)pbVar18 >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
      local_c8._120_8_ = local_c8._120_8_ & 0xffffffff00000000;
      RVar12 = ExprVisitor::VisitFunc(&local_c8.visitor_,pFVar14);
      pMVar36 = local_f0;
      if (RVar12.enum_ == Error) break;
      ppIVar32 = (pointer)(ulong)((int)local_f8 + 1);
      ppFVar17 = (local_f0->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (ppIVar32 <
             (pointer)((long)(local_f0->funcs).
                             super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppFVar17 >> 3));
  }
  ppTVar19 = (pMVar36->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppTVar27 = (pMVar36->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar27 != ppTVar19) {
    uVar33 = 0;
    do {
      if ((ppTVar19[uVar33]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->table_bindings,"T",(Index)uVar33,
                   &ppTVar19[uVar33]->name);
        ppTVar19 = (pMVar36->tables).
                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppTVar27 = (pMVar36->tables).
                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      uVar33 = (ulong)((Index)uVar33 + 1);
    } while (uVar33 < (ulong)((long)ppTVar27 - (long)ppTVar19 >> 3));
  }
  ppMVar20 = (pMVar36->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppMVar28 = (pMVar36->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar28 != ppMVar20) {
    uVar33 = 0;
    do {
      if ((ppMVar20[uVar33]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->memory_bindings,"M",(Index)uVar33,
                   &ppMVar20[uVar33]->name);
        ppMVar20 = (pMVar36->memories).
                   super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppMVar28 = (pMVar36->memories).
                   super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      uVar33 = (ulong)((Index)uVar33 + 1);
    } while (uVar33 < (ulong)((long)ppMVar28 - (long)ppMVar20 >> 3));
  }
  ppTVar21 = (pMVar36->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar29 = (pMVar36->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppTVar29 != ppTVar21) {
    uVar33 = 0;
    do {
      if ((ppTVar21[uVar33]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->tag_bindings,"e",(Index)uVar33,
                   &ppTVar21[uVar33]->name);
        ppTVar21 = (pMVar36->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar29 = (pMVar36->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar33 = (ulong)((Index)uVar33 + 1);
    } while (uVar33 < (ulong)((long)ppTVar29 - (long)ppTVar21 >> 3));
  }
  ppDVar22 = (pMVar36->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar30 = (pMVar36->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppDVar30 != ppDVar22) {
    uVar33 = 0;
    do {
      if ((ppDVar22[uVar33]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->data_segment_bindings,"d",(Index)uVar33,
                   &ppDVar22[uVar33]->name);
        ppDVar22 = (pMVar36->data_segments).
                   super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppDVar30 = (pMVar36->data_segments).
                   super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar33 = (ulong)((Index)uVar33 + 1);
    } while (uVar33 < (ulong)((long)ppDVar30 - (long)ppDVar22 >> 3));
  }
  ppEVar23 = (pMVar36->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppEVar31 = (pMVar36->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppEVar31 != ppEVar23) {
    uVar33 = 0;
    do {
      if ((ppEVar23[uVar33]->name)._M_string_length == 0) {
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&local_c8,&(local_c8.module_)->elem_segment_bindings,"e",(Index)uVar33,
                   &ppEVar23[uVar33]->name);
        ppEVar23 = (pMVar36->elem_segments).
                   super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar31 = (pMVar36->elem_segments).
                   super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar33 = (ulong)((Index)uVar33 + 1);
    } while (uVar33 < (ulong)((long)ppEVar31 - (long)ppEVar23 >> 3));
  }
  local_c8.module_ = (Module *)0x0;
  local_c8.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameGenerator_001a2d68;
  if (local_c8.visitor_.catch_index_stack_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.catch_index_stack_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.visitor_.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.visitor_.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.visitor_.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.visitor_.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.visitor_.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.visitor_.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.visitor_.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)Ok;
}

Assistant:

Result GenerateNames(Module* module, NameOpts opts) {
  NameGenerator generator(opts);
  return generator.VisitModule(module);
}